

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O2

void __thiscall
google::protobuf::util::converter::ProtoStreamObjectWriter::~ProtoStreamObjectWriter
          (ProtoStreamObjectWriter *this)

{
  Item *pIVar1;
  tuple<google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
  tVar2;
  __uniq_ptr_impl<google::protobuf::util::converter::StructuredObjectWriter::BaseElement,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
  _Var3;
  
  (this->super_ProtoWriter).super_StructuredObjectWriter.super_ObjectWriter._vptr_ObjectWriter =
       (_func_int **)&PTR__ProtoStreamObjectWriter_003e4010;
  pIVar1 = (this->current_)._M_t.
           super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter::Item,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter::Item>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter::Item_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter::Item>_>
           .
           super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter::Item_*,_false>
           ._M_head_impl;
  if (pIVar1 != (Item *)0x0) {
    _Var3._M_t.
    super__Tuple_impl<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
    .
    super__Head_base<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_false>
    ._M_head_impl =
         (pIVar1->super_BaseElement).parent_._M_t.
         super___uniq_ptr_impl<google::protobuf::util::converter::StructuredObjectWriter::BaseElement,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
         ._M_t;
    (pIVar1->super_BaseElement).parent_._M_t.
    super___uniq_ptr_impl<google::protobuf::util::converter::StructuredObjectWriter::BaseElement,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
         = (__uniq_ptr_impl<google::protobuf::util::converter::StructuredObjectWriter::BaseElement,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
            )0x0;
    while ((_Tuple_impl<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
            )_Var3._M_t.
             super__Tuple_impl<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
             .
             super__Head_base<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_false>
             ._M_head_impl != (BaseElement *)0x0) {
      tVar2.
      super__Tuple_impl<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
      .
      super__Head_base<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_false>
      ._M_head_impl =
           *(_Tuple_impl<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
             *)((long)_Var3._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
                      .
                      super__Head_base<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_false>
                      ._M_head_impl + 8);
      *(undefined8 *)
       ((long)_Var3._M_t.
              super__Tuple_impl<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
              .
              super__Head_base<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_false>
              ._M_head_impl + 8) = 0;
      (**(code **)(*(long *)_Var3._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
                            .
                            super__Head_base<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_false>
                            ._M_head_impl + 8))();
      _Var3._M_t.
      super__Tuple_impl<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
      .
      super__Head_base<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_false>
      ._M_head_impl =
           (tuple<google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
            )(tuple<google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
              )tVar2.
               super__Tuple_impl<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
               .
               super__Head_base<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_false>
               ._M_head_impl;
    }
  }
  std::
  unique_ptr<google::protobuf::util::converter::ProtoStreamObjectWriter::Item,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter::Item>_>
  ::~unique_ptr(&this->current_);
  ProtoWriter::~ProtoWriter(&this->super_ProtoWriter);
  return;
}

Assistant:

ProtoStreamObjectWriter::~ProtoStreamObjectWriter() {
  if (current_ == nullptr) return;
  // Cleanup explicitly in order to avoid destructor stack overflow when input
  // is deeply nested.
  // Cast to BaseElement to avoid doing additional checks (like missing fields)
  // during pop().
  std::unique_ptr<BaseElement> element(
      static_cast<BaseElement*>(current_.get())->pop<BaseElement>());
  while (element != nullptr) {
    element.reset(element->pop<BaseElement>());
  }
}